

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O1

int verify_miniscript_andor(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  miniscript_node_t *pmVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = 0;
  pmVar1 = node->child;
  for (pmVar2 = pmVar1; pmVar2 != (miniscript_node_t *)0x0; pmVar2 = pmVar2->next) {
    iVar5 = iVar5 + 1;
  }
  iVar4 = -2;
  if (iVar5 == node->info->inner_num) {
    uVar3 = verify_miniscript_andor_property
                      (pmVar1->type_properties,pmVar1->next->type_properties,
                       pmVar1->next->next->type_properties);
    node->type_properties = uVar3;
    iVar4 = (uint)(uVar3 != 0) * 2 + -2;
  }
  return iVar4;
}

Assistant:

static int verify_miniscript_andor(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    (void)parent;
    if (get_child_list_count(node) != node->info->inner_num)
        return WALLY_EINVAL;

    node->type_properties = verify_miniscript_andor_property(
        node->child->type_properties,
        node->child->next->type_properties,
        node->child->next->next->type_properties);
    if (!node->type_properties)
        return WALLY_EINVAL;

    return WALLY_OK;
}